

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O1

void * rzalloc_array_size(void *ctx,size_t size,uint count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  size_t size_00;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = CONCAT44(0,count);
  if (SUB168(auVar1 * auVar2,8) == 0) {
    size_00 = CONCAT44(0,count) * size;
    pvVar3 = ralloc_size(ctx,size_00);
    if (pvVar3 != (void *)0x0) {
      pvVar3 = memset(pvVar3,0,size_00);
      return pvVar3;
    }
  }
  else {
    pvVar3 = (void *)0x0;
  }
  return pvVar3;
}

Assistant:

void *
rzalloc_array_size(const void *ctx, size_t size, unsigned count)
{
   if (count > SIZE_MAX/size)
      return NULL;

   return rzalloc_size(ctx, size * count);
}